

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O0

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
            *this)

{
  bool bVar1;
  compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  in_stack_ffffffffffffff88;
  undefined1 local_5e [6];
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_58;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_50;
  iterator_range<const_int_*> *local_48;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_40;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *local_38;
  iterator_range<const_int_*> *range;
  undefined1 local_26 [6];
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_20;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_18;
  merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  *local_10;
  merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
  *this_local;
  
  local_18._M_current = (this->m_begin)._M_current;
  local_20._M_current = (this->m_end)._M_current;
  local_10 = this;
  each<burst::front_t_const&>((front_t *)&burst::front);
  invert<std::greater<void>&>((greater<void> *)&this->field_0x10);
  burst::operator|(local_26);
  std::
  pop_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            (local_18,local_20,in_stack_ffffffffffffff88);
  local_48 = (this->m_end)._M_current;
  local_40 = std::
             prev<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>
                       ((__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                         )local_48,1);
  local_38 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
             __gnu_cxx::
             __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
             ::operator*(&local_40);
  boost::iterator_range<const_int_*>::advance_begin((iterator_range<const_int_*> *)local_38,1);
  bVar1 = boost::iterator_range_detail::
          iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::empty
                    (local_38);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
    ::operator--(&this->m_end);
  }
  else {
    local_50._M_current = (this->m_begin)._M_current;
    local_58._M_current = (this->m_end)._M_current;
    each<burst::front_t_const&>((front_t *)&burst::front);
    invert<std::greater<void>&>((greater<void> *)&this->field_0x10);
    burst::operator|(local_5e);
    std::
    push_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::greater<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
              (local_50,local_58,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }